

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O1

ostream * __thiscall OpenMD::DumpWriter::createOStream(DumpWriter *this,string *filename)

{
  pointer pcVar1;
  char cVar2;
  ostream *this_00;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  this_00 = (ostream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,(filename->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"<OpenMD version=2>",0x12);
  cVar2 = (char)this_00;
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"  <MetaData>",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  pcVar1 = (this->info_->rawMetaData_)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->info_->rawMetaData_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"  </MetaData>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return this_00;
}

Assistant:

std::ostream* DumpWriter::createOStream(const std::string& filename) {
    std::ostream* newOStream;
#ifdef HAVE_ZLIB
    if (needCompression_) {
      newOStream = new ogzstream(filename.c_str());
    } else {
      newOStream = new std::ofstream(filename.c_str());
    }
#else
    newOStream = new std::ofstream(filename.c_str());
#endif
    // write out MetaData first
    (*newOStream) << "<OpenMD version=2>" << std::endl;
    (*newOStream) << "  <MetaData>" << std::endl;
    (*newOStream) << info_->getRawMetaData();
    (*newOStream) << "  </MetaData>" << std::endl;
    return newOStream;
  }